

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::AssembleElement(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                  *this,TPZCompEl *el,TPZElementMatrix *ekb,TPZElementMatrix *efb,
                 TPZMatrix<std::complex<double>_> *stiffness,TPZFMatrix<std::complex<double>_> *rhs)

{
  int iVar1;
  long *plVar2;
  TPZVec<long> *pTVar3;
  undefined8 in_RCX;
  TPZVec<long> *in_RDX;
  TPZVec<long> *in_RSI;
  TPZStructMatrix *in_RDI;
  long *in_R8;
  TPZFMatrix<std::complex<double>_> *unaff_retaddr;
  TPZElementMatrixT<std::complex<double>_> *ef;
  TPZElementMatrixT<std::complex<double>_> *ek;
  TPZElementMatrix *in_stack_00000080;
  TPZVec<long> *origindex;
  TPZStructMatrix *rhs_00;
  
  rhs_00 = in_RDI;
  plVar2 = (long *)__dynamic_cast(in_RDX,&TPZElementMatrix::typeinfo,
                                  &TPZElementMatrixT<std::complex<double>>::typeinfo,0);
  if (plVar2 == (long *)0x0) {
    __cxa_bad_cast();
  }
  pTVar3 = (TPZVec<long> *)
           __dynamic_cast(in_RCX,&TPZElementMatrix::typeinfo,
                          &TPZElementMatrixT<std::complex<double>>::typeinfo,0);
  if (pTVar3 == (TPZVec<long> *)0x0) {
    __cxa_bad_cast();
  }
  origindex = pTVar3;
  iVar1 = (*in_RSI->_vptr_TPZVec[0x3e])();
  if (iVar1 == 0) {
    TPZElementMatrix::ComputeDestinationIndices(in_stack_00000080);
    ::TPZStructMatrix::FilterEquations(in_RDI,origindex,(TPZVec<long> *)0x1dc8c69);
    (**(code **)(*in_R8 + 0x1a0))(in_R8,plVar2 + 0x3e,plVar2 + 0x2d,plVar2 + 0x1f);
    TPZFMatrix<std::complex<double>_>::AddFel
              (unaff_retaddr,(TPZFMatrix<std::complex<double>_> *)rhs_00,in_RSI,in_RDX);
  }
  else {
    (**(code **)(*plVar2 + 0x30))();
    (*pTVar3->_vptr_TPZVec[6])();
    TPZElementMatrix::ComputeDestinationIndices(in_stack_00000080);
    ::TPZStructMatrix::FilterEquations(in_RDI,origindex,(TPZVec<long> *)0x1dc8d10);
    (**(code **)(*in_R8 + 0x1a0))(in_R8,plVar2 + 0x83c,plVar2 + 0x2d,plVar2 + 0x1f);
    TPZFMatrix<std::complex<double>_>::AddFel
              (unaff_retaddr,(TPZFMatrix<std::complex<double>_> *)rhs_00,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleElement(TPZCompEl * el, TPZElementMatrix & ekb, TPZElementMatrix & efb, TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs){
	//TODOCOMPLEX
    auto &ek =
		dynamic_cast<TPZElementMatrixT<TVar>&>(ekb);
	auto &ef =
		dynamic_cast<TPZElementMatrixT<TVar>&>(efb);
	
	if(!el->HasDependency()) {
		//ek.fMat->Print("stiff has no constraint",test);
		//ef.fMat->Print("rhs has no constraint",test);
		//test.flush();
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
            std::stringstream sout;
            sout << "Element index " << el->Index() << " Unconstrained destination index " << ek.fDestinationIndex;
            LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		//ek.Print(*fMesh,cout);
		stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
		rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);                 //  ??????????? Erro
	}
	else
	{
        ek.ApplyConstraints();
        ef.ApplyConstraints();
        ek.ComputeDestinationIndices();
        this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
			std::stringstream sout;
			sout << "Element index " << el->Index() << " Constrained destination index " << ek.fDestinationIndex;
			LOGPZ_DEBUG(logger,sout.str())
        }
#endif
        stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
        rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
	}
}